

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::rebuildOrderHeap(Solver *this)

{
  bool bVar1;
  char *pcVar2;
  vec<int,_int> vs;
  lbool local_3d;
  Var local_3c;
  vec<int,_int> local_38;
  
  local_38.data = (int *)0x0;
  local_38.sz = 0;
  local_38.cap = 0;
  for (local_3c = 0; local_3c < this->next_var; local_3c = local_3c + 1) {
    pcVar2 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                       (&(this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                        local_3c);
    if (*pcVar2 != '\0') {
      local_3d = value(this,local_3c);
      bVar1 = lbool::operator==(&local_3d,l_Undef);
      if (bVar1) {
        vec<int,_int>::push(&local_38,&local_3c);
      }
    }
  }
  Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::build
            (&this->order_heap,&local_38);
  vec<int,_int>::~vec(&local_38);
  return;
}

Assistant:

void Solver::rebuildOrderHeap()
{
    vec<Var> vs;
    for (Var v = 0; v < nVars(); v++)
        if (decision[v] && value(v) == l_Undef)
            vs.push(v);
    order_heap.build(vs);
}